

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TLaplaceExample1::uxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *disp)

{
  int iVar1;
  double *pdVar2;
  Fad<double> *pFVar3;
  int i_3;
  int i_2;
  long lVar4;
  int i_1;
  int i;
  long lVar5;
  double __y;
  double __y_00;
  double __y_01;
  double __y_02;
  double __y_03;
  double __y_04;
  undefined8 uVar6;
  double in_XMM1_Qa;
  Fad<double> theta;
  Fad<double> t;
  Fad<double> mult;
  Fad<double> Prod;
  Fad<double> temp;
  undefined1 local_538 [8];
  undefined8 local_530;
  Fad<double> *pFStack_528;
  Fad<double> *local_520;
  undefined1 local_518 [8];
  undefined8 local_510;
  double *pdStack_508;
  Fad<double> *local_500;
  undefined1 local_4f8 [12];
  uint uStack_4ec;
  double *local_4e8;
  Fad<double> *pFStack_4e0;
  undefined1 local_4d8 [16];
  Fad<double> *local_4c8;
  undefined1 local_4c0 [8];
  Fad<double> *local_4b8;
  Fad<double> *local_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  Fad<double> coef;
  Fad<double> local_468;
  Fad<double> local_448;
  Fad<double> local_428;
  Fad<double> local_408;
  Fad<double> local_3e8;
  Fad<double> local_3c8;
  Fad<double> local_3a8;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  TLaplaceExample1 *local_358;
  TPZManVector<Fad<double>,_3> xloc;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  Fad<double> local_2b0;
  Fad<double> local_290;
  Fad<double> local_270;
  Fad<double> local_250;
  Fad<double> local_230;
  Fad<double> local_210;
  Fad<double> local_1f0;
  Fad<double> local_1d0;
  Fad<double> local_1b0;
  Fad<double> local_190;
  Fad<double> local_170;
  Fad<double> local_150;
  Fad<double> local_130;
  Fad<double> r2;
  Fad<double> r;
  Fad<double> local_d0;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  TPZManVector<Fad<double>,_3>::TPZManVector(&xloc,x);
  pdVar2 = (this->fCenter).super_TPZVec<double>.fStore;
  lVar4 = 0;
  pFVar3 = xloc.super_TPZVec<Fad<double>_>.fStore;
  if (xloc.super_TPZVec<Fad<double>_>.fNElements < 1) {
    xloc.super_TPZVec<Fad<double>_>.fNElements = lVar4;
  }
  for (; xloc.super_TPZVec<Fad<double>_>.fNElements != lVar4; lVar4 = lVar4 + 1) {
    pFVar3->val_ = pFVar3->val_ - pdVar2[lVar4];
    pFVar3 = pFVar3 + 1;
  }
  r2.val_ = 0.0;
  r2.dx_.num_elts = 0;
  r2.dx_.ptr_to_data = (double *)0x0;
  r2.defaultVal = 0.0;
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar5 = lVar5 + 1) {
    coef.val_ = (double)((long)&(xloc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar4);
    coef.dx_._0_8_ = coef.val_;
    Fad<double>::operator+=(&r2,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&coef);
    lVar4 = lVar4 + 0x20;
  }
  sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&coef,&r2);
  Fad<double>::Fad<FadFuncSqrt<Fad<double>>>(&r,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)&coef);
  Fad<double>::~Fad((Fad<double> *)&coef.dx_);
  coef.val_ = 0.0;
  coef.dx_._0_8_ = coef.dx_._0_8_ & 0xffffffff00000000;
  coef.dx_.ptr_to_data = (double *)0x0;
  coef.defaultVal = 0.0;
  theta.val_ = (double)xloc.super_TPZVec<Fad<double>_>.fStore;
  theta.dx_._0_8_ = &coef;
  Fad<double>::operator=(disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&theta);
  Fad<double>::~Fad(&coef);
  Fad<double>::Fad(&local_130,x->fStore);
  Fad<double>::Fad(&local_50,x->fStore + 1);
  Fad<double>::~Fad(&local_50);
  Fad<double>::~Fad(&local_130);
  switch(this->fExact) {
  case EConst:
    disp->fStore->val_ = gC + disp->fStore->val_;
    break;
  case EX:
    Fad<double>::operator+=<double,_nullptr>(disp->fStore,xloc.super_TPZVec<Fad<double>_>.fStore);
    break;
  case ESinSin:
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    Fad<double>::operator+=<double,_nullptr>(disp->fStore,&coef);
    Fad<double>::~Fad(&coef);
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar4 = lVar4 + 1)
    {
      coef.val_ = 3.141592653589793;
      coef.dx_._0_8_ = coef.dx_._0_8_ & 0xffffffff00000000;
      coef.dx_.ptr_to_data = (double *)0x0;
      coef.defaultVal = 0.0;
      theta.dx_.ptr_to_data =
           (double *)((long)&(xloc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5);
      theta.dx_._0_8_ = &coef;
      Fad<double>::operator*=
                (disp->fStore,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)&theta)
      ;
      Fad<double>::~Fad(&coef);
      lVar5 = lVar5 + 0x20;
    }
    break;
  case ECosCos:
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    Fad<double>::operator+=<double,_nullptr>(disp->fStore,&coef);
    Fad<double>::~Fad(&coef);
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar4 = lVar4 + 1)
    {
      coef.val_ = 3.141592653589793;
      coef.dx_._0_8_ = coef.dx_._0_8_ & 0xffffffff00000000;
      coef.dx_.ptr_to_data = (double *)0x0;
      coef.defaultVal = 0.0;
      t.dx_._0_8_ = (long)&(xloc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5;
      theta.dx_.ptr_to_data = (double *)0x2;
      theta.dx_._0_8_ = &t;
      t.val_ = (double)&coef;
      Fad<double>::operator*=
                (disp->fStore,
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<int>_>_>_>_>
                  *)&theta);
      Fad<double>::~Fad(&coef);
      lVar5 = lVar5 + 0x20;
    }
    break;
  case EArcTan:
    coef.val_ = 0.5;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    t.val_ = (double)&mult;
    t.dx_.num_elts = 0;
    t.dx_._4_4_ = 0x40590000;
    t.dx_.ptr_to_data = (double *)0x0;
    mult.val_ = (double)&r;
    mult.dx_._0_8_ = &coef;
    Fad<double>::Fad<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,FadCst<double>>>
              (&theta,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)&t);
    Fad<double>::~Fad(&coef);
    t.val_ = 10.0;
    t.dx_._0_8_ = t.dx_._0_8_ & 0xffffffff00000000;
    coef.val_ = 1.0;
    coef.dx_._0_8_ = coef.dx_._0_8_ & 0xffffffff00000000;
    local_378._0_8_ = &Prod;
    Prod.val_ = 0.3;
    Prod.dx_._0_8_ = (ulong)(uint)Prod.dx_._4_4_ << 0x20;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    local_388._0_8_ = &temp;
    temp.val_ = 3.141592653589793;
    temp.dx_._0_8_ = (ulong)(uint)temp.dx_._4_4_ << 0x20;
    Prod.dx_.ptr_to_data = (double *)0x0;
    Prod.defaultVal = 0.0;
    temp.dx_.ptr_to_data = (double *)0x0;
    temp.defaultVal = 0.0;
    local_4b8 = (Fad<double> *)local_388;
    local_388._8_8_ = xloc.super_TPZVec<Fad<double>_>.fStore;
    local_378._8_8_ = local_4c0;
    local_498._8_8_ = local_378;
    local_4a8._0_8_ = local_498;
    local_368._0_8_ = local_538;
    local_538 = (undefined1  [8])0x3ff0000000000000;
    local_530 = (Fad<double> *)((ulong)local_530._4_4_ << 0x20);
    local_2c0._0_8_ = local_518;
    local_518 = (undefined1  [8])0x3fe0000000000000;
    local_510 = (Fad<double> *)((ulong)local_510._4_4_ << 0x20);
    pFStack_528 = (Fad<double> *)0x0;
    local_520 = (Fad<double> *)0x0;
    pdStack_508 = (double *)0x0;
    local_500 = (Fad<double> *)0x0;
    local_2d0._0_8_ = local_4f8;
    local_4f8._0_8_ = (Fad<double> *)0x400921fb54442d18;
    stack0xfffffffffffffb10 = (Fad<double> *)((ulong)uStack_4ec << 0x20);
    local_4e8 = (double *)0x0;
    pFStack_4e0 = (Fad<double> *)0x0;
    local_4d8._8_8_ = local_2d0;
    local_2c0._8_8_ = local_4d8;
    local_368._8_8_ = local_2c0;
    local_4a8._8_8_ = local_368;
    local_4c8 = &t;
    local_4b0 = &t;
    local_498._0_8_ = &coef;
    local_2d0._8_8_ = &r;
    Fad<double>::
    Fad<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>>>>>,FadExpr<FadBinaryAdd<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>>>>>>>
              (&mult,(FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                      *)local_4a8);
    Fad<double>::~Fad((Fad<double> *)local_4f8);
    Fad<double>::~Fad((Fad<double> *)local_518);
    Fad<double>::~Fad((Fad<double> *)local_538);
    Fad<double>::~Fad(&temp);
    Fad<double>::~Fad(&Prod);
    Fad<double>::~Fad(&coef);
    atan<double>((FadExpr<FadFuncAtan<Fad<double>_>_> *)&coef,&theta);
    Prod.val_ = (double)&coef;
    Prod.dx_._0_8_ = &mult;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *)&Prod);
    pFVar3 = (Fad<double> *)&coef.dx_;
    goto LAB_01219b82;
  case EArcTanSingular:
    iVar1 = *(int *)&(this->super_TPZAnalyticSolution).field_0xc;
    if (iVar1 == 1) {
      uVar6._0_4_ = 0;
      uVar6._4_4_ = 0x3ff40000;
    }
    else {
      uVar6 = *(undefined8 *)(&DAT_013603c0 + (ulong)(iVar1 == 3) * 8);
    }
    temp.val_ = (double)&theta;
    theta.val_ = 0.5;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    coef.val_ = (double)&t;
    t.val_ = 20.0;
    t.dx_._0_8_ = (ulong)(uint)t.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    Prod.val_ = (double)&temp;
    coef.dx_._0_8_ = &Prod;
    Prod.dx_._0_8_ = &r2;
    temp.dx_._0_8_ = temp.val_;
    Fad<double>::
    Fad<FadBinaryMul<Fad<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>
              (&mult,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                      *)&coef);
    Prod.val_ = 1.0;
    Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
    Prod.dx_.ptr_to_data = (double *)0x0;
    Prod.defaultVal = 0.0;
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar4 = lVar4 + 1)
    {
      temp.val_ = (double)((long)&x->fStore->val_ + lVar5);
      coef.dx_.num_elts = 0;
      coef.dx_._4_4_ = 0x3ff00000;
      coef.dx_.ptr_to_data = (double *)0x0;
      temp.dx_._0_8_ = &coef;
      coef.defaultVal = temp.val_;
      Fad<double>::operator*=
                (&Prod,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                        *)&temp);
      lVar5 = lVar5 + 0x20;
    }
    atan<double>((FadExpr<FadFuncAtan<Fad<double>_>_> *)&coef,&mult);
    local_530 = (Fad<double> *)0x3ff921fb54442d18;
    pFStack_528 = (Fad<double> *)0x0;
    local_520 = &coef;
    Fad<double>::Fad<FadBinaryAdd<FadCst<double>,FadExpr<FadFuncAtan<Fad<double>>>>>
              (&temp,(FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadFuncAtan<Fad<double>_>_>_>_> *
                     )local_538);
    Fad<double>::~Fad((Fad<double> *)&coef.dx_);
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.dx_._0_8_ = uVar6;
    coef.defaultVal = (double)&temp;
    Fad<double>::operator=
              (disp->fStore,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&coef);
    Fad<double>::~Fad(&temp);
    pFVar3 = &Prod;
LAB_01219b82:
    Fad<double>::~Fad(pFVar3);
    pFVar3 = &mult;
    goto LAB_01219b8c;
  case ESinDist:
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    Fad<double>::operator+=<double,_nullptr>(disp->fStore,&coef);
    Fad<double>::~Fad(&coef);
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar4 = lVar4 + 1)
    {
      theta.val_ = 3.141592653589793;
      theta.dx_._0_8_ = theta.dx_._0_8_ & 0xffffffff00000000;
      theta.dx_.ptr_to_data = (double *)0x0;
      theta.defaultVal = 0.0;
      t.dx_._0_8_ = (long)&(xloc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5;
      coef.dx_.ptr_to_data = (double *)0x3ff199999999999a;
      coef.defaultVal = 0.0;
      t.val_ = (double)&theta;
      coef.dx_._0_8_ = &t;
      Fad<double>::operator*=
                (disp->fStore,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)&coef);
      Fad<double>::~Fad(&theta);
      lVar5 = lVar5 + 0x20;
    }
    break;
  case E10SinSin:
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    Fad<double>::operator+=<double,_nullptr>(disp->fStore,&coef);
    Fad<double>::~Fad(&coef);
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar4 = lVar4 + 1)
    {
      theta.val_ = 3.141592653589793;
      theta.dx_._0_8_ = theta.dx_._0_8_ & 0xffffffff00000000;
      theta.dx_.ptr_to_data = (double *)0x0;
      theta.defaultVal = 0.0;
      t.dx_._0_8_ = (long)&(xloc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5;
      coef.dx_.ptr_to_data = (double *)0x4024000000000000;
      coef.defaultVal = 0.0;
      t.val_ = (double)&theta;
      coef.dx_._0_8_ = &t;
      Fad<double>::operator*=
                (disp->fStore,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)&coef);
      Fad<double>::~Fad(&theta);
      lVar5 = lVar5 + 0x20;
    }
    break;
  case E2SinSin:
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    Fad<double>::operator+=<double,_nullptr>(disp->fStore,&coef);
    Fad<double>::~Fad(&coef);
    lVar5 = 0;
    for (lVar4 = 0; lVar4 < *(int *)&(this->super_TPZAnalyticSolution).field_0xc; lVar4 = lVar4 + 1)
    {
      theta.val_ = 3.141592653589793;
      theta.dx_._0_8_ = theta.dx_._0_8_ & 0xffffffff00000000;
      theta.dx_.ptr_to_data = (double *)0x0;
      theta.defaultVal = 0.0;
      t.dx_._0_8_ = (long)&(xloc.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar5;
      coef.dx_.ptr_to_data = (double *)0x4000000000000000;
      coef.defaultVal = 0.0;
      t.val_ = (double)&theta;
      coef.dx_._0_8_ = &t;
      Fad<double>::operator*=
                (disp->fStore,
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)&coef);
      Fad<double>::~Fad(&theta);
      lVar5 = lVar5 + 0x20;
    }
    break;
  case ESinSinDirNonHom:
    coef.val_ = 3.141592653589793;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    Prod.dx_._0_8_ = &temp;
    temp.dx_.num_elts = 0;
    temp.dx_._4_4_ = 0x40000000;
    temp.dx_.ptr_to_data = (double *)0x0;
    local_4c0 = (undefined1  [8])&Prod;
    Prod.dx_.ptr_to_data = &(xloc.super_TPZVec<Fad<double>_>.fStore)->val_;
    theta.val_ = 3.141592653589793;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    local_530 = (Fad<double> *)local_518;
    local_518 = (undefined1  [8])&theta;
    local_510 = (Fad<double> *)0x4000000000000000;
    pdStack_508 = (double *)0x0;
    pFStack_528 = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
    local_4b8 = (Fad<double> *)local_538;
    local_4f8._0_8_ = local_4c0;
    local_4d8._0_8_ = &t;
    t.val_ = 1.0;
    t.dx_._0_8_ = (ulong)(uint)t.dx_._4_4_ << 0x20;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    local_4a8._0_8_ = local_498;
    local_498._0_8_ = xloc.super_TPZVec<Fad<double>_>.fStore;
    local_4a8._8_8_ = &mult;
    mult.val_ = 1.0;
    mult.dx_._0_8_ = mult.dx_._0_8_ & 0xffffffff00000000;
    mult.dx_.ptr_to_data = (double *)0x0;
    mult.defaultVal = 0.0;
    local_4d8._8_8_ = local_4a8;
    unique0x00005300 = (Fad<double> *)local_4d8;
    temp.val_ = (double)&coef;
    local_498._8_8_ = pFStack_528;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)local_4f8);
    goto LAB_01219c85;
  case ESinMark:
    Fad<double>::Fad(&local_150,xloc.super_TPZVec<Fad<double>_>.fStore + 1);
    Fad<double>::Fad(&local_170,xloc.super_TPZVec<Fad<double>_>.fStore);
    atan2(__y_03,in_XMM1_Qa);
    Fad<double>::~Fad(&local_170);
    Fad<double>::~Fad(&local_150);
    Fad<double>::Fad(&local_70,&coef);
    Fad<double>::~Fad(&local_70);
    if (local_70.val_ < 0.0) {
      coef.val_ = coef.val_ + 6.283185307179586;
    }
    if (((local_50.val_ <= -1e-15) || (local_130.val_ <= 0.0)) || (1e-15 <= local_50.val_)) {
      temp.val_ = (double)&t;
      t.val_ = 2.0;
      t.dx_._0_8_ = t.dx_._0_8_ & 0xffffffff00000000;
      temp.dx_._0_8_ = &mult;
      mult.val_ = 3.0;
      mult.dx_._0_8_ = mult.dx_._0_8_ & 0xffffffff00000000;
      t.dx_.ptr_to_data = (double *)0x0;
      t.defaultVal = 0.0;
      mult.dx_.ptr_to_data = (double *)0x0;
      mult.defaultVal = 0.0;
      Prod.dx_._0_8_ = &temp;
      Prod.val_ = (double)&r;
      Fad<double>::Fad<FadBinaryPow<Fad<double>,FadExpr<FadBinaryDiv<Fad<double>,Fad<double>>>>>
                (&theta,(FadExpr<FadBinaryPow<Fad<double>,_FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>_>
                         *)&Prod);
      Fad<double>::~Fad(&mult);
      Fad<double>::~Fad(&t);
      t.val_ = 2.0;
      t.dx_._0_8_ = t.dx_._0_8_ & 0xffffffff00000000;
      t.dx_.ptr_to_data = (double *)0x0;
      t.defaultVal = 0.0;
      Prod.dx_._0_8_ = local_538;
      mult.val_ = 3.0;
      mult.dx_._0_8_ = mult.dx_._0_8_ & 0xffffffff00000000;
      local_530 = &coef;
      mult.dx_.ptr_to_data = (double *)0x0;
      mult.defaultVal = 0.0;
      Prod.dx_.ptr_to_data = &mult.val_;
      temp.val_ = (double)&theta;
      temp.dx_._0_8_ = &Prod;
      local_538 = (undefined1  [8])&t;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                  *)&temp);
      goto LAB_01219c85;
    }
    theta.val_ = 0.0;
    Fad<double>::operator=<double,_nullptr>(disp->fStore,&theta.val_);
    goto LAB_01219ca3;
  case ESteklovNonConst:
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    local_468.val_ = 0.44721359549995787;
    local_468.dx_.num_elts = 0;
    local_468.dx_.ptr_to_data = (double *)0x0;
    local_468.defaultVal = 0.0;
    local_448.val_ = 2.3333333333333326;
    local_448.dx_.num_elts = 0;
    local_448.dx_.ptr_to_data = (double *)0x0;
    local_448.defaultVal = 0.0;
    local_428.val_ = -0.7453559924999296;
    local_428.dx_.num_elts = 0;
    local_428.dx_.ptr_to_data = (double *)0x0;
    local_428.defaultVal = 0.0;
    local_408.val_ = 0.5555555555555556;
    local_408.dx_.num_elts = 0;
    local_408.dx_.ptr_to_data = (double *)0x0;
    local_408.defaultVal = 0.0;
    local_3e8.val_ = -0.9441175904999111;
    local_3e8.dx_.num_elts = 0;
    local_3e8.dx_.ptr_to_data = (double *)0x0;
    local_3e8.defaultVal = 0.0;
    local_3c8.val_ = -0.48148148148148173;
    local_3c8.dx_.num_elts = 0;
    local_3c8.dx_.ptr_to_data = (double *)0x0;
    local_3c8.defaultVal = 0.0;
    local_3a8.val_ = -2.4017026424997736;
    local_3a8.dx_.num_elts = 0;
    theta.val_ = 0.53544094560246;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    local_3a8.dx_.ptr_to_data = (double *)0x0;
    local_3a8.defaultVal = 0.0;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    Fad<double>::Fad(&local_190,xloc.super_TPZVec<Fad<double>_>.fStore + 1);
    Fad<double>::Fad(&local_1b0,xloc.super_TPZVec<Fad<double>_>.fStore);
    atan2(__y_00,in_XMM1_Qa);
    Fad<double>::~Fad(&local_1b0);
    Fad<double>::~Fad(&local_190);
    Fad<double>::Fad(&local_90,&t);
    Fad<double>::~Fad(&local_90);
    if (local_90.val_ < 0.0) {
      t.val_ = t.val_ + 6.283185307179586;
    }
    if ((0.0 <= local_130.val_) && (0.0 <= local_50.val_)) {
      local_4f8._0_8_ = &r;
      unique0x10003758 = &theta;
      Fad<double>::Fad(&mult,&coef);
      local_4d8._8_8_ = &temp;
      temp.dx_._0_8_ = &theta;
      temp.dx_.ptr_to_data = &t.val_;
      local_4d8._0_8_ = &mult;
      Fad<double>::Fad(&Prod,&local_468);
      local_4a8._8_8_ = local_538;
      local_4b8 = (Fad<double> *)local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_510 = (Fad<double> *)local_4c0;
      local_518 = (undefined1  [8])local_4f8;
      local_530 = &theta;
      pFStack_528 = &t;
      local_4a8._0_8_ = &Prod;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)local_518);
      Fad<double>::~Fad(&Prod);
      Fad<double>::~Fad(&mult);
    }
    if ((local_130.val_ <= 0.0) && (0.0 <= local_50.val_)) {
      local_4f8._0_8_ = &r;
      unique0x10003760 = &theta;
      Fad<double>::Fad(&mult,&local_448);
      local_4d8._8_8_ = &temp;
      temp.dx_._0_8_ = &theta;
      temp.dx_.ptr_to_data = &t.val_;
      local_4d8._0_8_ = &mult;
      Fad<double>::Fad(&Prod,&local_428);
      local_4a8._8_8_ = local_538;
      local_4b8 = (Fad<double> *)local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_510 = (Fad<double> *)local_4c0;
      local_518 = (undefined1  [8])local_4f8;
      local_530 = &theta;
      pFStack_528 = &t;
      local_4a8._0_8_ = &Prod;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)local_518);
      Fad<double>::~Fad(&Prod);
      Fad<double>::~Fad(&mult);
    }
    if ((local_130.val_ < 0.0) && (local_50.val_ <= 0.0)) {
      local_4f8._0_8_ = &r;
      unique0x10003768 = &theta;
      Fad<double>::Fad(&mult,&local_408);
      local_4d8._8_8_ = &temp;
      temp.dx_._0_8_ = &theta;
      temp.dx_.ptr_to_data = &t.val_;
      local_4d8._0_8_ = &mult;
      Fad<double>::Fad(&Prod,&local_3e8);
      local_4a8._8_8_ = local_538;
      local_4b8 = (Fad<double> *)local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_510 = (Fad<double> *)local_4c0;
      local_518 = (undefined1  [8])local_4f8;
      local_530 = &theta;
      pFStack_528 = &t;
      local_4a8._0_8_ = &Prod;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)local_518);
      Fad<double>::~Fad(&Prod);
      Fad<double>::~Fad(&mult);
    }
    if ((0.0 <= local_130.val_) && (local_50.val_ < 0.0)) {
      local_4f8._0_8_ = &r;
      unique0x10003770 = &theta;
      Fad<double>::Fad(&mult,&local_3c8);
      local_4d8._8_8_ = &temp;
      temp.dx_._0_8_ = &theta;
      temp.dx_.ptr_to_data = &t.val_;
      local_4d8._0_8_ = &mult;
      Fad<double>::Fad(&Prod,&local_3a8);
      local_4a8._8_8_ = local_538;
      local_4b8 = (Fad<double> *)local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_510 = (Fad<double> *)local_4c0;
      local_518 = (undefined1  [8])local_4f8;
      local_530 = &theta;
      pFStack_528 = &t;
      local_4a8._0_8_ = &Prod;
      Fad<double>::operator=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                  *)local_518);
      Fad<double>::~Fad(&Prod);
      Fad<double>::~Fad(&mult);
    }
    Fad<double>::~Fad(&t);
    Fad<double>::~Fad(&theta);
    lVar4 = 0xe0;
    do {
      Fad<double>::~Fad((Fad<double> *)((long)&coef.val_ + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    break;
  case EGalvisNonConst:
    coef.val_ = 2.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    theta.val_ = 5.0;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    if ((local_130.val_ <= 0.0) && (local_50.val_ <= 0.0)) {
      local_510 = &Prod;
      Prod.val_ = 1.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      local_518 = (undefined1  [8])xloc.super_TPZVec<Fad<double>_>.fStore;
      temp.dx_._0_8_ = &mult;
      mult.dx_.num_elts = 0x54442d18;
      mult.dx_._4_4_ = 0x400921fb;
      mult.dx_.ptr_to_data = (double *)0x0;
      local_530 = (Fad<double> *)0x3ff0000000000000;
      pFStack_528 = (Fad<double> *)0x0;
      mult.defaultVal = (double)local_518;
      temp.dx_.ptr_to_data = (double *)local_538;
      local_538 = (undefined1  [8])&coef;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,FadCst<double>>>>>>>
                (&t,(FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>_>_>_>_>
                     *)&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = 4.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      local_4a8._0_8_ = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      local_4d8._8_8_ = local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_4b8 = (Fad<double> *)local_498;
      local_498._0_8_ = &theta;
      local_4f8._0_8_ = local_4c0;
      local_538 = (undefined1  [8])0x3ff0000000000000;
      local_530 = (Fad<double> *)((ulong)local_530 & 0xffffffff00000000);
      pFStack_528 = (Fad<double> *)0x0;
      local_520 = (Fad<double> *)0x0;
      local_378._0_8_ = local_388;
      local_518 = (undefined1  [8])0x3ff0000000000000;
      local_510 = (Fad<double> *)((ulong)local_510 & 0xffffffff00000000);
      pdStack_508 = (double *)0x0;
      local_500 = (Fad<double> *)0x0;
      local_378._8_8_ = local_368;
      unique0x00005300 = (Fad<double> *)local_378;
      local_4d8._0_8_ = &Prod;
      local_4a8._8_8_ = &temp;
      local_498._8_8_ = local_4a8._0_8_;
      local_388._0_8_ = local_498._0_8_;
      local_388._8_8_ = (Fad<double> *)local_538;
      local_368._0_8_ = local_498._0_8_;
      local_368._8_8_ = local_518;
      Fad<double>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&mult,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                        *)local_4f8);
      Fad<double>::~Fad((Fad<double> *)local_518);
      Fad<double>::~Fad((Fad<double> *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = (double)&t;
      Prod.dx_._0_8_ = &mult;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&Prod);
      Fad<double>::~Fad(&mult);
      Fad<double>::~Fad(&t);
    }
    if ((0.0 < local_130.val_) && (local_50.val_ < 0.0)) {
      local_518 = (undefined1  [8])local_4f8;
      stack0xfffffffffffffb10 = xloc.super_TPZVec<Fad<double>_>.fStore;
      local_510 = &Prod;
      Prod.val_ = 1.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      mult.defaultVal = (double)local_518;
      local_530 = &mult;
      mult.dx_.num_elts = 0x54442d18;
      mult.dx_._4_4_ = 0x400921fb;
      mult.dx_.ptr_to_data = (double *)0x0;
      local_4b8 = &temp;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      pFStack_528 = (Fad<double> *)local_4c0;
      local_4f8._0_8_ = &coef;
      local_4c0 = (undefined1  [8])&coef;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&t,(FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                     *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = 4.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      local_4a8._0_8_ = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      local_4d8._8_8_ = local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_4b8 = (Fad<double> *)local_498;
      local_498._0_8_ = &theta;
      local_538 = (undefined1  [8])0x3ff0000000000000;
      local_530 = (Fad<double> *)((ulong)local_530 & 0xffffffff00000000);
      pFStack_528 = (Fad<double> *)0x0;
      local_520 = (Fad<double> *)0x0;
      local_378._0_8_ = local_388;
      local_518 = (undefined1  [8])0x3ff0000000000000;
      local_510 = (Fad<double> *)((ulong)local_510 & 0xffffffff00000000);
      pdStack_508 = (double *)0x0;
      local_500 = (Fad<double> *)0x0;
      local_378._8_8_ = local_368;
      local_368._8_8_ = local_518;
      unique0x00005300 = (Fad<double> *)local_378;
      local_4f8._0_8_ = (Fad<double> *)local_4c0;
      local_4d8._0_8_ = &Prod;
      local_4a8._8_8_ = &temp;
      local_498._8_8_ = local_4a8._0_8_;
      local_388._0_8_ = local_498._0_8_;
      local_388._8_8_ = (Fad<double> *)local_538;
      local_368._0_8_ = local_498._0_8_;
      Fad<double>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&mult,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                        *)local_4f8);
      Fad<double>::~Fad((Fad<double> *)local_518);
      Fad<double>::~Fad((Fad<double> *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = (double)&t;
      Prod.dx_._0_8_ = &mult;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&Prod);
      Fad<double>::~Fad(&mult);
      Fad<double>::~Fad(&t);
    }
    if ((local_130.val_ < 0.0) && (0.0 <= local_50.val_)) {
      local_510 = &Prod;
      Prod.val_ = 1.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      local_518 = (undefined1  [8])xloc.super_TPZVec<Fad<double>_>.fStore;
      local_530 = &mult;
      mult.dx_.num_elts = 0x54442d18;
      mult.dx_._4_4_ = 0x400921fb;
      mult.dx_.ptr_to_data = (double *)0x0;
      unique0x00005300 = &temp;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      pFStack_528 = (Fad<double> *)local_4f8;
      mult.defaultVal = (double)local_518;
      local_4f8._0_8_ = &coef;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&t,(FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                     *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = 4.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      local_498._8_8_ = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4a8._0_8_ = local_498;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      local_498._0_8_ = &theta;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      local_4d8._8_8_ = local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_378._8_8_ = local_388;
      local_4b8 = (Fad<double> *)local_378;
      local_4f8._0_8_ = local_4c0;
      local_538 = (undefined1  [8])0x3ff0000000000000;
      local_530 = (Fad<double> *)((ulong)local_530 & 0xffffffff00000000);
      pFStack_528 = (Fad<double> *)0x0;
      local_520 = (Fad<double> *)0x0;
      local_368._0_8_ = local_2c0;
      local_518 = (undefined1  [8])0x3ff0000000000000;
      local_510 = (Fad<double> *)((ulong)local_510 & 0xffffffff00000000);
      pdStack_508 = (double *)0x0;
      local_500 = (Fad<double> *)0x0;
      local_368._8_8_ = local_2d0;
      unique0x00005300 = (Fad<double> *)local_368;
      local_4d8._0_8_ = &Prod;
      local_4a8._8_8_ = &temp;
      local_388._0_8_ = local_498._0_8_;
      local_388._8_8_ = local_498._8_8_;
      local_378._0_8_ = local_498._0_8_;
      local_2d0._0_8_ = local_498._0_8_;
      local_2d0._8_8_ = (Fad<double> *)local_518;
      local_2c0._0_8_ = local_498._0_8_;
      local_2c0._8_8_ =
           (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
            *)local_538;
      Fad<double>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&mult,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                        *)local_4f8);
      Fad<double>::~Fad((Fad<double> *)local_518);
      Fad<double>::~Fad((Fad<double> *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = (double)&t;
      Prod.dx_._0_8_ = &mult;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&Prod);
      Fad<double>::~Fad(&mult);
      Fad<double>::~Fad(&t);
    }
    if ((0.0 <= local_130.val_) && (0.0 <= local_50.val_)) {
      local_518 = (undefined1  [8])local_4f8;
      stack0xfffffffffffffb10 = xloc.super_TPZVec<Fad<double>_>.fStore;
      local_510 = &Prod;
      Prod.val_ = 1.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      local_530 = &mult;
      mult.dx_.num_elts = 0x54442d18;
      mult.dx_._4_4_ = 0x400921fb;
      mult.dx_.ptr_to_data = (double *)0x0;
      local_4b8 = &temp;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      mult.defaultVal = (double)local_518;
      pFStack_528 = (Fad<double> *)local_4c0;
      local_4f8._0_8_ = &coef;
      local_4c0 = (undefined1  [8])&coef;
      Fad<double>::
      Fad<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&t,(FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                     *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = 4.0;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      local_498._8_8_ = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
      local_4a8._0_8_ = local_498;
      local_498._0_8_ = &theta;
      temp.val_ = 1.0;
      temp.dx_._0_8_ = temp.dx_._0_8_ & 0xffffffff00000000;
      temp.dx_.ptr_to_data = (double *)0x0;
      temp.defaultVal = 0.0;
      local_4d8._8_8_ = local_4a8;
      local_4c0 = (undefined1  [8])local_4d8;
      local_378._8_8_ = local_388;
      local_4b8 = (Fad<double> *)local_378;
      local_538 = (undefined1  [8])0x3ff0000000000000;
      local_530 = (Fad<double> *)((ulong)local_530 & 0xffffffff00000000);
      pFStack_528 = (Fad<double> *)0x0;
      local_520 = (Fad<double> *)0x0;
      local_368._0_8_ = local_2c0;
      local_518 = (undefined1  [8])0x3ff0000000000000;
      local_510 = (Fad<double> *)((ulong)local_510 & 0xffffffff00000000);
      pdStack_508 = (double *)0x0;
      local_500 = (Fad<double> *)0x0;
      local_368._8_8_ = local_2d0;
      unique0x00005300 = (Fad<double> *)local_368;
      local_4f8._0_8_ = (Fad<double> *)local_4c0;
      local_4d8._0_8_ = &Prod;
      local_4a8._8_8_ = &temp;
      local_388._0_8_ = local_498._0_8_;
      local_388._8_8_ = local_498._8_8_;
      local_378._0_8_ = local_498._0_8_;
      local_2d0._0_8_ = local_498._0_8_;
      local_2d0._8_8_ = (Fad<double> *)local_518;
      local_2c0._0_8_ = local_498._0_8_;
      local_2c0._8_8_ =
           (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
            *)local_538;
      Fad<double>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>,FadExpr<FadBinaryAdd<Fad<double>,Fad<double>>>>>>>
                (&mult,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
                        *)local_4f8);
      Fad<double>::~Fad((Fad<double> *)local_518);
      Fad<double>::~Fad((Fad<double> *)local_538);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
      Prod.val_ = (double)&t;
      Prod.dx_._0_8_ = &mult;
      Fad<double>::operator=
                (disp->fStore,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&Prod);
      goto LAB_01219c85;
    }
    goto LAB_01219c99;
  case EBoundaryLayer:
    t.defaultVal = (double)(xloc.super_TPZVec<Fad<double>_>.fStore + 1);
    temp.val_ = (double)xloc.super_TPZVec<Fad<double>_>.fStore;
    theta.dx_.num_elts = 0;
    theta.dx_._4_4_ = 0x3ff00000;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = (double)xloc.super_TPZVec<Fad<double>_>.fStore;
    Prod.dx_._0_8_ = &theta;
    t.dx_.num_elts = 0;
    t.dx_._4_4_ = 0x3ff00000;
    t.dx_.ptr_to_data = (double *)0x0;
    mult.val_ = (double)&Prod;
    mult.dx_._0_8_ = &t;
    Prod.val_ = (double)&temp;
    temp.dx_._0_8_ = t.defaultVal;
    Fad<double>::
    Fad<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
              (&coef,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                      *)&mult);
    t.val_ = 10.0;
    t.dx_._0_8_ = t.dx_._0_8_ & 0xffffffff00000000;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    mult.val_ = 10.0;
    mult.dx_._0_8_ = mult.dx_._0_8_ & 0xffffffff00000000;
    Prod.dx_.ptr_to_data = &(xloc.super_TPZVec<Fad<double>_>.fStore)->val_;
    mult.dx_.ptr_to_data = (double *)0x0;
    mult.defaultVal = 0.0;
    temp.dx_.ptr_to_data = &xloc.super_TPZVec<Fad<double>_>.fStore[1].val_;
    Prod.dx_._0_8_ = &t;
    temp.dx_._0_8_ = &mult;
    local_538 = (undefined1  [8])&Prod;
    local_530 = &temp;
    Fad<double>::
    Fad<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              (&theta,(FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                       *)local_538);
    Fad<double>::~Fad(&mult);
    Fad<double>::~Fad(&t);
    t.val_ = 537930.0;
    t.dx_._0_8_ = t.dx_._0_8_ & 0xffffffff00000000;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    mult.val_ = (double)&Prod;
    mult.dx_._0_8_ = &t;
    Prod.val_ = (double)&coef;
    Prod.dx_._0_8_ = &theta;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)&mult);
    goto LAB_01219c8f;
  case EBubble:
    local_510 = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
    local_538 = (undefined1  [8])local_518;
    local_518 = (undefined1  [8])xloc.super_TPZVec<Fad<double>_>.fStore;
    local_530 = xloc.super_TPZVec<Fad<double>_>.fStore + 2;
    temp.val_ = (double)local_538;
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    temp.dx_._0_8_ = local_4f8;
    stack0xfffffffffffffb10 = xloc.super_TPZVec<Fad<double>_>.fStore;
    Prod.val_ = (double)&temp;
    theta.val_ = 1.0;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    Prod.dx_._0_8_ = local_4c0;
    local_4c0 = (undefined1  [8])&theta;
    mult.val_ = (double)&Prod;
    local_4d8._0_8_ = &t;
    t.val_ = 1.0;
    t.dx_._0_8_ = (ulong)(uint)t.dx_._4_4_ << 0x20;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    mult.dx_._0_8_ = local_4d8;
    local_4f8._0_8_ = &coef;
    local_4d8._8_8_ = local_530;
    local_4b8 = local_510;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)&mult);
    goto LAB_01219c8f;
  case EBubble2D:
    Prod.dx_._0_8_ = xloc.super_TPZVec<Fad<double>_>.fStore + 1;
    mult.val_ = (double)&Prod;
    Prod.val_ = (double)xloc.super_TPZVec<Fad<double>_>.fStore;
    coef.val_ = 1.0;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    mult.dx_._0_8_ = &temp;
    temp.dx_._0_8_ = xloc.super_TPZVec<Fad<double>_>.fStore;
    t.val_ = (double)&mult;
    theta.val_ = 1.0;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    t.dx_._0_8_ = local_538;
    local_538 = (undefined1  [8])&theta;
    temp.val_ = (double)&coef;
    local_530 = (Fad<double> *)Prod.dx_._0_8_;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                *)&t);
    goto LAB_01219c99;
  case ESinCosCircle:
    theta.val_ = 4.0;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    t.dx_._0_8_ = &theta;
    t.val_ = (double)&r;
    Fad<double>::Fad<FadBinaryPow<Fad<double>,Fad<double>>>
              (&coef,(FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)&t);
    Fad<double>::~Fad(&theta);
    Fad<double>::Fad(&local_1d0,xloc.super_TPZVec<Fad<double>_>.fStore + 1);
    Fad<double>::Fad(&local_1f0,xloc.super_TPZVec<Fad<double>_>.fStore);
    atan2(__y,in_XMM1_Qa);
    Fad<double>::~Fad(&local_1f0);
    Fad<double>::~Fad(&local_1d0);
    t.val_ = 2.0;
    t.dx_._0_8_ = t.dx_._0_8_ & 0xffffffff00000000;
    t.dx_.ptr_to_data = (double *)0x0;
    t.defaultVal = 0.0;
    local_510 = &Prod;
    local_538 = (undefined1  [8])local_518;
    temp.dx_._0_8_ = &mult;
    mult.val_ = 2.0;
    mult.dx_._0_8_ = (ulong)(uint)mult.dx_._4_4_ << 0x20;
    mult.dx_.ptr_to_data = (double *)0x0;
    mult.defaultVal = 0.0;
    local_530 = &temp;
    Prod.dx_._0_8_ = &t;
    Prod.dx_.ptr_to_data = &theta.val_;
    temp.dx_.ptr_to_data = &theta.val_;
    local_518 = (undefined1  [8])&coef;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                *)local_538);
LAB_01219c85:
    Fad<double>::~Fad(&mult);
LAB_01219c8f:
    Fad<double>::~Fad(&t);
    goto LAB_01219c99;
  case EHarmonic:
    local_468.val_ = (double)x->fStore;
    coef.dx_.ptr_to_data = (double *)0x400921fb54442d18;
    coef.defaultVal = 0.0;
    theta.dx_.ptr_to_data = (double *)0x400921fb54442d18;
    theta.defaultVal = 0.0;
    t.dx_._0_8_ = &theta;
    t.val_ = (double)&coef;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)&t);
    break;
  case EHarmonic2:
    coef.val_ = 0.25;
    coef.dx_._0_8_ = (ulong)(uint)coef.dx_._4_4_ << 0x20;
    coef.dx_.ptr_to_data = (double *)0x0;
    coef.defaultVal = 0.0;
    theta.val_ = 1.5707963267948966;
    theta.dx_._0_8_ = (ulong)(uint)theta.dx_._4_4_ << 0x20;
    theta.dx_.ptr_to_data = (double *)0x0;
    theta.defaultVal = 0.0;
    t.dx_._0_8_ = x->fStore;
    local_4f8._0_8_ = local_4c0;
    unique0x00004e80 = &t;
    t.dx_.ptr_to_data = &theta.val_;
    local_518 = (undefined1  [8])local_4f8;
    mult.dx_._0_8_ = t.dx_._0_8_ + 0x20;
    local_510 = &mult;
    local_538 = (undefined1  [8])local_518;
    local_4a8._0_8_ = local_498;
    local_4a8._8_8_ = &Prod;
    local_4d8._0_8_ = local_4a8;
    local_4d8._8_8_ = &temp;
    local_530 = (Fad<double> *)local_4d8;
    mult.dx_.ptr_to_data = t.dx_.ptr_to_data;
    Prod.dx_._0_8_ = t.dx_._0_8_;
    Prod.dx_.ptr_to_data = t.dx_.ptr_to_data;
    temp.dx_._0_8_ = mult.dx_._0_8_;
    temp.dx_.ptr_to_data = t.dx_.ptr_to_data;
    local_4c0 = (undefined1  [8])t.dx_._0_8_;
    local_4b8 = &coef;
    local_498._0_8_ = mult.dx_._0_8_;
    local_498._8_8_ = &coef;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSinh<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_538);
LAB_01219c99:
    Fad<double>::~Fad(&theta);
LAB_01219ca3:
    pFVar3 = &coef;
LAB_01219cab:
    Fad<double>::~Fad(pFVar3);
    break;
  case ESquareRootUpper:
    t.val_ = (double)x->fStore;
    coef.dx_._0_8_ = &t;
    mult.val_ = (double)((long)t.val_ + 0x20);
    t.dx_._0_8_ = t.val_;
    mult.dx_._0_8_ = mult.val_;
    coef.dx_.ptr_to_data = &mult.val_;
    Fad<double>::
    Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              (&theta,(FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                       *)&coef);
    Fad<double>::Fad(&local_290,x->fStore + 1);
    Fad<double>::Fad(&local_2b0,x->fStore);
    atan2(__y_04,in_XMM1_Qa);
    Fad<double>::~Fad(&local_2b0);
    Fad<double>::~Fad(&local_290);
    Fad<double>::Fad(&local_d0,&t);
    Fad<double>::~Fad(&local_d0);
    if (local_d0.val_ < 0.0) {
      t.val_ = t.val_ + 6.283185307179586;
    }
    sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&coef,&theta);
    mult.dx_.num_elts = 0xa31b715;
    mult.dx_._4_4_ = 0x3ff306fe;
    mult.dx_.ptr_to_data = (double *)0x0;
    temp.dx_._0_8_ = &Prod;
    Prod.dx_.ptr_to_data = (double *)0x2;
    mult.defaultVal = (double)&coef;
    Prod.dx_._0_8_ = &t;
    temp.val_ = (double)&mult;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&temp);
    goto LAB_012199b7;
  case ESquareRootLower:
    t.val_ = (double)x->fStore;
    coef.dx_._0_8_ = &t;
    mult.val_ = (double)((long)t.val_ + 0x20);
    t.dx_._0_8_ = t.val_;
    mult.dx_._0_8_ = mult.val_;
    coef.dx_.ptr_to_data = &mult.val_;
    Fad<double>::
    Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              (&theta,(FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                       *)&coef);
    Fad<double>::Fad(&local_250,x->fStore + 1);
    Fad<double>::Fad(&local_270,x->fStore);
    atan2(__y_01,in_XMM1_Qa);
    Fad<double>::~Fad(&local_270);
    Fad<double>::~Fad(&local_250);
    Fad<double>::Fad(&local_b0,&t);
    Fad<double>::~Fad(&local_b0);
    if (0.0 < local_b0.val_) {
      t.val_ = t.val_ + -6.283185307179586;
    }
    sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&coef,&theta);
    mult.dx_.num_elts = 0xa31b715;
    mult.dx_._4_4_ = 0x3ff306fe;
    mult.dx_.ptr_to_data = (double *)0x0;
    temp.dx_._0_8_ = &Prod;
    Prod.dx_.ptr_to_data = (double *)0x2;
    mult.defaultVal = (double)&coef;
    Prod.dx_._0_8_ = &t;
    temp.val_ = (double)&mult;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&temp);
    goto LAB_012199b7;
  case ESquareRoot:
    t.val_ = (double)x->fStore;
    coef.dx_._0_8_ = &t;
    mult.val_ = (double)((long)t.val_ + 0x20);
    t.dx_._0_8_ = t.val_;
    mult.dx_._0_8_ = mult.val_;
    coef.dx_.ptr_to_data = &mult.val_;
    Fad<double>::
    Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
              (&theta,(FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
                       *)&coef);
    Fad<double>::Fad(&local_210,x->fStore + 1);
    Fad<double>::Fad(&local_230,x->fStore);
    atan2(__y_02,in_XMM1_Qa);
    Fad<double>::~Fad(&local_230);
    Fad<double>::~Fad(&local_210);
    sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&coef,&theta);
    mult.dx_.num_elts = 0xa31b715;
    mult.dx_._4_4_ = 0x3ff306fe;
    mult.dx_.ptr_to_data = (double *)0x0;
    temp.dx_._0_8_ = &Prod;
    Prod.dx_.ptr_to_data = (double *)0x2;
    mult.defaultVal = (double)&coef;
    Prod.dx_._0_8_ = &t;
    temp.val_ = (double)&mult;
    Fad<double>::operator=
              (disp->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>_>
                *)&temp);
LAB_012199b7:
    pFVar3 = (Fad<double> *)&coef.dx_;
LAB_01219b8c:
    Fad<double>::~Fad(pFVar3);
    Fad<double>::~Fad(&t);
    pFVar3 = &theta;
    goto LAB_01219cab;
  case ELaplace2D:
    Fad<double>::Fad(&mult);
    coef.val_ = 1.0;
    Fad<double>::operator=<double,_nullptr>(disp->fStore,&coef.val_);
    local_358 = this;
    for (pFVar3 = (Fad<double> *)0x1; (long)pFVar3 <= (long)this->fmaxIter;
        pFVar3 = (Fad<double> *)((long)&pFVar3->val_ + 1)) {
      Prod.val_ = (double)(int)pFVar3 * 3.141592653589793;
      Prod.dx_._0_8_ = Prod.dx_._0_8_ & 0xffffffff00000000;
      Prod.dx_.ptr_to_data = (double *)0x0;
      Prod.defaultVal = 0.0;
      tanh<double>((FadExpr<FadFuncTanh<Fad<double>_>_> *)&coef,&Prod);
      local_4b8 = (Fad<double> *)0xfffffffe;
      local_4b0 = &coef;
      cos<double>((FadExpr<FadFuncCos<Fad<double>_>_> *)&theta,&Prod);
      local_510 = (Fad<double> *)0x3fb9f02f6222c722;
      pdStack_508 = (double *)0x0;
      local_530 = (Fad<double> *)0x3fb9f02f6222c722;
      pFStack_528 = (Fad<double> *)0x0;
      local_520 = (Fad<double> *)local_518;
      local_500 = &theta;
      sin<double>((FadExpr<FadFuncSin<Fad<double>_>_> *)&t,&Prod);
      register0x00001200 = (Fad<double> *)((double)(int)pFVar3 * 0.1591549430918954);
      local_4e8 = (double *)0x0;
      local_498._0_8_ = local_538;
      local_498._8_8_ = local_4f8;
      local_4a8._0_8_ = local_4c0;
      local_4a8._8_8_ = local_498;
      local_378._0_8_ = local_388;
      local_4d8._0_8_ = local_4a8;
      local_4d8._8_8_ = local_378;
      pFStack_4e0 = &t;
      local_388._0_8_ = &Prod;
      local_388._8_8_ = pFVar3;
      local_378._8_8_ = pFVar3;
      Fad<double>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,FadExpr<FadFuncTanh<Fad<double>>>>>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncCos<Fad<double>>>>>>>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSin<Fad<double>>>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,FadCst<int>>>,FadCst<int>>>>>
                (&temp,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadCst<int>_>_>,_FadCst<int>_>_>_>_>
                        *)local_4d8);
      this = local_358;
      Fad<double>::~Fad((Fad<double> *)&t.dx_);
      Fad<double>::~Fad((Fad<double> *)&theta.dx_);
      Fad<double>::~Fad((Fad<double> *)&coef.dx_);
      cosh<double>((FadExpr<FadFuncCosh<Fad<double>_>_> *)&coef,&Prod);
      theta.dx_.ptr_to_data = &x->fStore->val_;
      local_518 = (undefined1  [8])local_4f8;
      local_510 = &theta;
      local_4c0 = (undefined1  [8])((long)theta.dx_.ptr_to_data + 0x20);
      local_4b8 = (Fad<double> *)0x1;
      t.dx_.ptr_to_data = (double *)local_4c0;
      theta.dx_._0_8_ = &Prod;
      t.dx_._0_8_ = &Prod;
      local_538 = (undefined1  [8])local_518;
      local_530 = &t;
      local_4f8._0_8_ = &temp;
      unique0x10003750 = &coef;
      Fad<double>::operator+=
                (disp->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCosh<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>_>_>_>_>_>_>
                  *)local_538);
      Fad<double>::~Fad((Fad<double> *)&coef.dx_);
      Fad<double>::~Fad(&temp);
      Fad<double>::~Fad(&Prod);
    }
    pFVar3 = &mult;
    goto LAB_01219cab;
  default:
    coef.val_ = 0.0;
    Fad<double>::operator=<double,_nullptr>(disp->fStore,&coef.val_);
  }
  Fad<double>::~Fad(&r);
  Fad<double>::~Fad(&r2);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xloc);
  return;
}

Assistant:

void TLaplaceExample1::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &disp) const
{
    TPZManVector<TVar,3> xloc(x);
    for (int i = 0; i<xloc.size(); i++) {
        xloc[i] -= fCenter[i];
    }
    TVar r2 = 0.;
    for (int i=0; i<fDimension; i++) {
        r2 += xloc[i]*xloc[i];
    }
    TVar r = sqrt(r2);
    disp[0] = xloc[0]*(TVar)(0.);
    
    REAL xval[2] = {shapeFAD::val(x[0]),shapeFAD::val(x[1])};
     
    switch (fExact) {
        case EConst:
            disp[0] += gC;
            break;
        case EX:
            disp[0] += xloc[0];
            break;
        case ESinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]);
        }
            break;
        case E10SinSin:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*10.);
        }
            break;
            
            case E2SinSin:
            {
                disp[0] += (TVar)(1.);
                for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*2.);
            }
                break;
        case ESinDist:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= sin((TVar)M_PI*xloc[i]*1.1);
        }
            break;
        case ECosCos:
        {
            disp[0] += (TVar)(1.);
            for(int i=0; i<fDimension; i++) disp[0] *= cos((TVar)M_PI*xloc[i]/2);
        }
            break;
        case EArcTan://(1+0.3sin(10Pi x))*(1+0.5cos(10Pi r)*arctan(100*(r-0.5))
        {
            TVar atanco = (r-(TVar)0.5)*100.;
            TVar freq = 10.;
            TVar mult = (TVar(1)+TVar(0.3)*sin(TVar(M_PI)*xloc[0]*freq))*(TVar(1)+TVar(0.5)*cos(TVar(M_PI)*r*freq));
            disp[0] = atan(atanco)*mult;
        }
            break;
        case EArcTanSingular://5*(0.5*pi + arctang(20(0.25 - r^2))))
        {
            REAL B = 5.;
            if(fDimension==1)
                B *= 0.25;
            else if(fDimension==3)
                B *= 4;
            // Argument value (arc) to compute ArcTangent( arc )
            TVar RCircle = 0.5;
            TVar Force = 20.;
            TVar arc = Force*(RCircle*RCircle-r2);
            TVar Prod = 1.;
            for (int i=0; i<fDimension; i++) {
                Prod *= x[i]*(1.-x[i]);
            }
            TVar temp = 0.5*M_PI + atan(arc);
            disp[0] = B*temp;
        }
            break;
            
            //----
        case ESinMark://(r^(2/3)-r^2)sin(20/3) para homogeneo dirichlet e r^(2/3)sin(20/3) para f=0
        {

            TVar theta = atan2(xloc[1], xloc[0]);//theta=arctan(y/x)
            auto thetaval = shapeFAD::val(theta);
            if (thetaval < (0.)) theta += 2. * M_PI;

            // Verification to avoid numerical errors when x > 0 and y = 0
            if (xval[0] > 0 && xval[1] < 1e-15 && xval[1] > -1.e-15) {
               disp[0] = 0.;
            }
            else {
                TVar factor = pow(r,TVar (2.)/TVar (3.));//pow(r,TVar (2.)/TVar (3.))-pow(r,TVar (2.));//
                disp[0] = factor * (sin((TVar) (2.) * theta / TVar(3.)));
            }


        }
            break;
            
            //--
     
        case ESinSinDirNonHom: //sin(2 pi x)sin(2pi y)+1/(x+y+1)
        {
            
            disp[0]=(sin((TVar)M_PI*2.*xloc[0]))*sin((TVar)M_PI*2.*xloc[1])+(TVar)1./(xloc[0]+xloc[1]+(TVar)(1.));
            
        }
            
            break;
            
        case ESteklovNonConst://Steklov function for eigenvalue lambda=0.53544094560246 and permeability Omega1=Omega=3, Omega2=Omega4=5
        {
            TVar coefs[] = {1., 0.44721359549995787, 2.3333333333333326,
                -0.7453559924999296, 0.5555555555555556,
                -0.9441175904999111, -0.48148148148148173,
                -2.4017026424997736};
            TVar lambda = 0.53544094560246;
            TVar t = atan2(xloc[1], xloc[0]);
            REAL tval = shapeFAD::val(t);
            if(tval < (0.)) t += 2.*M_PI;
            
            if((xval[0] >=(0.)) && (xval[1] >=(0.))){
               // std::cout<<"1o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]=pow(r, lambda)*(TVar(coefs[0])*cos(lambda *t) + TVar(coefs[1])*sin(lambda*t) );
               // std::cout<<"valor da funcao no 1o. Q "<<disp[0]<<std::endl;
               // disp[0]=pow(r, lambda)*(cos(lambda *t)+TVar(-1.)*TVar(0.1)*sin(lambda*t));
                
            }
            
            if(( xval[0] <= (0.)) && (xval[1] >=(0.))){
               // std::cout<<"2o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                
                disp[0]= pow(r, lambda)*(TVar(coefs[2])*cos(lambda*t) + TVar(coefs[3])*sin(lambda* t));
                
             //    std::cout<<"valor da funcao no 2o. Q "<<disp[0]<<std::endl;
            }
            
            if((xval[0] <(0.)) && ( xval[1] <= (0.))){
               // std::cout<<"3o. Q "<<xloc<< " r " << r << " th " << t << std::endl;
                disp[0]= pow(r, lambda)*(TVar(coefs[4] )*cos(lambda*t) + TVar(coefs[5])*sin(lambda* t));
                //disp[0]= pow(r, lambda)*(TVar(-1.)*TVar(0.882757 )*cos(lambda*t) + TVar(-1.)*TVar(0.480355)*sin(lambda* t));
              //   std::cout<<"valor da funcao no 3o. Q "<<disp[0]<<std::endl;
            }
            if(( xval[0] >= (0.)) && ( xval[1] < (0.))){
              //  std::cout<<"4o. Q "<<xloc<< " r " << r << " th " << t << std::endl;

                disp[0]= pow(r, lambda)*(TVar(coefs[6])*cos(lambda*t) +  TVar(coefs[7])*sin(lambda* t));
                
               // std::cout<<"valor da funcao no 4o. Q "<<disp[0]<<std::endl;
                
            }
            
            
        }
            break;
            
            case EGalvisNonConst:
        {
            
            TVar k1 = 2;
            TVar k2 = 5;
            
            
            if((xval[0] <= (0.)) && (xval[1] <= (0.))){
                
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+1.));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"3o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if(( xval[0] > (0.)) && (xval[1] < (0.))){
             
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1 + TVar(1.)));
                TVar u2 = TVar(4.)*(xloc[1]+TVar(1.))*(k2-xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"4o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            
            if((xval[0] < (0.)) && ( xval[1] >= (0.))){
              
                TVar u1 = sin(M_PI*(xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
           //     std::cout<<"2o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
            }
            if(( xval[0] >= (0.)) && ( xval[1] >= (0.))){
               
                
                TVar u1 = sin(M_PI*(k1*xloc[0]+TVar(1.))/(k1+TVar(1.)));
                TVar u2 = TVar(4.)*(k2*xloc[1]+TVar(1.))*(k2-k2*xloc[1])/((k2+TVar(1.))*(k2+TVar(1.)));
                
                disp[0]=u1*u2;
            //    std::cout<<"1o. Q "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
                
                
            }
            
            
        }
            break;
            
        case EBoundaryLayer:{
            TVar term1 = xloc[0]*xloc[1]*(1.-xloc[0])*(1.-xloc[1]);
            TVar term2 = exp(TVar(10.)*xloc[0])*exp(TVar(10.)*xloc[1]);
            TVar factor = TVar(537930);
            
            disp[0] = (term1*term2)/factor;
            
          //  std::cout<<"Pto "<<xloc<<" valor da funcao "<<disp[0]<<std::endl;
            
            
        }
            break;
            
        case EBubble:{
            
            disp[0] = xloc[0]*xloc[1]*xloc[2]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1])*(TVar(1.)-xloc[2]);
           // std::cout<<"pto "<<xloc <<" f(x) "<<disp<<std::endl;
        }
            break;
        case EBubble2D:{

            disp[0] = xloc[0]*xloc[1]*(TVar(1.)-xloc[0])*(TVar(1.)-xloc[1]);
        }
            break;
        case ESinCosCircle:{
            
            TVar coef = pow(r, TVar(4.));
            TVar theta=atan2(xloc[1],xloc[0]);
            disp[0] = coef*sin(TVar(2.)*theta)*cos(TVar(2.)*theta);
            
            
        }
            break;
        case EHarmonic:
            disp[0] = exp(M_PI*x[0])*sin(M_PI*x[1]);
            break;

        case EHarmonic2:
        {
            TVar a1 = 1./4;
            TVar alpha = M_PI/2;
            disp[0] = x[0]*a1*cos(x[0]*alpha)*cosh(x[1]*alpha) + x[1]*a1*sin(x[0]*alpha)*sinh(x[1]*alpha);
        }
            break;
        case ESquareRoot:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootLower:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) > 0.) {
                theta -= (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ESquareRootUpper:
        {
            TVar r = sqrt(x[0]*x[0]+x[1]*x[1]);
            TVar theta = atan2(x[1],x[0]);
            if (shapeFAD::val(theta) < 0.) {
                theta += (2.*M_PI);
            }
            disp[0] = pow(2.,1/4.)*sqrt(r)*cos(theta/2);
            //disp[0] = pow(2.,-1/4.)*sqrt(x[0] + sqrt(x[0]*x[0] + x[1]*x[1]));
        }
            break;

        case ELaplace2D:
        {
            TVar Ck;
            disp[0] = 1.;
            for(int k = 1 ; k < fmaxIter+1; k++){
                TVar kpi = k*M_PI;
                TVar ck = -2/tanh(kpi)*(0.1013211836423378 -0.1013211836423378*cos(kpi)-0.1591549430918954 *k* sin(kpi))/(kpi*k*k);
                disp[0]+=ck/cosh(kpi)*cos(kpi*x[0])*cosh(kpi*(x[1]-1));
            }
        }
            break;

        default:
            disp[0] = 0.;
            break;
    }
}